

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

int __thiscall
glslang::TSymbolValidater::checkLocationOverlap
          (TSymbolValidater *this,TRange *locationRange,
          vector<glslang::TRange,_std::allocator<glslang::TRange>_> *usedUniformLocation,
          TString *symbolName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          *usedUniformName,bool *diffLocation)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer pTVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  pTVar4 = (usedUniformLocation->
           super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = 0;
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    if ((ulong)((long)(usedUniformLocation->
                      super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pTVar4 >> 3) <= uVar6) {
      return -1;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)((long)&(((usedUniformName->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       super_allocator_type.allocator + lVar5),symbolName);
    if (bVar3) break;
    pTVar4 = (usedUniformLocation->
             super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)&pTVar4->start + lVar7);
    if ((iVar1 <= locationRange->last) &&
       (iVar2 = locationRange->start, iVar2 <= *(int *)((long)&pTVar4->last + lVar7))) {
      if (iVar2 <= iVar1) {
        return iVar1;
      }
      return iVar2;
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 8;
    lVar5 = lVar5 + 0x28;
  }
  *diffLocation = true;
  pTVar4 = (usedUniformLocation->
           super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = *(int *)((long)&pTVar4->start + lVar7);
  if ((iVar1 == locationRange->start) &&
     (*(int *)((long)&pTVar4->last + lVar7) == locationRange->last)) {
    return -2;
  }
  if (locationRange->start < iVar1) {
    locationRange = (TRange *)((long)&pTVar4->start + lVar7);
  }
  return locationRange->start;
}

Assistant:

int checkLocationOverlap(const TRange& locationRange, std::vector<TRange>& usedUniformLocation, const TString symbolName, std::vector<TString>& usedUniformName, bool& diffLocation)
    {
        for (size_t r = 0; r < usedUniformLocation.size(); ++r) {
            if (usedUniformName[r] == symbolName) {
                diffLocation = true;
                return (usedUniformLocation[r].start == locationRange.start &&
                        usedUniformLocation[r].last == locationRange.last)
                       ? -2 : std::max(locationRange.start, usedUniformLocation[r].start);
            }
            if (locationRange.overlap(usedUniformLocation[r])) {
                // there is a collision; pick one
                return std::max(locationRange.start, usedUniformLocation[r].start);
            }
        }

        return -1; // no collision
    }